

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O0

void __thiscall
TPZPostProcAnalysis::TPZPostProcAnalysis(TPZPostProcAnalysis *this,TPZCompMesh *pRef)

{
  undefined8 in_RSI;
  TPZRegisterClassId *in_RDI;
  void **in_stack_ffffffffffffffd8;
  TPZLinearAnalysis *this_00;
  
  this_00 = (TPZLinearAnalysis *)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZPostProcAnalysis>(in_RDI,0x21);
  TPZLinearAnalysis::TPZLinearAnalysis(this_00,in_stack_ffffffffffffffd8);
  *(undefined ***)in_RDI = &PTR__TPZPostProcAnalysis_02532340;
  *(undefined8 *)(in_RDI + 0x488) = in_RSI;
  TPZVec<TPZCompEl_*>::TPZVec((TPZVec<TPZCompEl_*> *)(in_RDI + 0x490));
  (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,in_RSI,0);
  return;
}

Assistant:

TPZPostProcAnalysis::TPZPostProcAnalysis(TPZCompMesh * pRef):TPZRegisterClassId(&TPZPostProcAnalysis::ClassId),
TPZLinearAnalysis(), fpMainMesh(pRef)
{
    
    SetCompMesh(pRef);
    
}